

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_TypeChecker.cpp
# Opt level: O0

void __thiscall
psy::C::TypeChecker::DiagnosticsReporter::ExpectedExpressionOfType_CORE
          (DiagnosticsReporter *this,SyntaxToken *tk,string *diagnosticID,string *category)

{
  SyntaxToken local_188;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  string local_100 [32];
  DiagnosticDescriptor local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string s;
  string *category_local;
  string *diagnosticID_local;
  SyntaxToken *tk_local;
  DiagnosticsReporter *this_local;
  
  s.field_2._8_8_ = category;
  std::operator+(&local_68,"expected expression of ",category);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68," type");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string(local_100,(string *)diagnosticID);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_120,"[[expected expression of type]]",&local_121);
  std::__cxx11::string::string(local_148,(string *)local_48);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_e0,local_100,local_120,local_148,2,4);
  local_188.field_10 = tk->field_10;
  local_188.tree_ = tk->tree_;
  local_188.syntaxK_ = tk->syntaxK_;
  local_188.byteSize_ = tk->byteSize_;
  local_188.charSize_ = tk->charSize_;
  local_188._14_2_ = *(undefined2 *)&tk->field_0xe;
  local_188.byteOffset_ = tk->byteOffset_;
  local_188.charOffset_ = tk->charOffset_;
  local_188.matchingBracket_ = tk->matchingBracket_;
  local_188.field_7 = tk->field_7;
  local_188._34_2_ = *(undefined2 *)&tk->field_0x22;
  local_188.lineno_ = tk->lineno_;
  local_188.column_ = tk->column_;
  local_188._44_4_ = *(undefined4 *)&tk->field_0x2c;
  diagnose(this,&local_e0,&local_188);
  SyntaxToken::~SyntaxToken(&local_188);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_e0);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void TypeChecker::DiagnosticsReporter::ExpectedExpressionOfType_CORE(
        SyntaxToken tk,
        const std::string& diagnosticID,
        const std::string& category)
{
    std::string s = "expected expression of "
            + category
            + " type";
    diagnose(DiagnosticDescriptor(
                 diagnosticID,
                 "[[expected expression of type]]",
                 s,
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::TypeChecking),
             tk);
}